

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O0

int mbedtls_ssl_set_hs_ecjpake_password(mbedtls_ssl_context *ssl,uchar *pw,size_t pw_len)

{
  mbedtls_ecjpake_role local_2c;
  mbedtls_ecjpake_role role;
  size_t pw_len_local;
  uchar *pw_local;
  mbedtls_ssl_context *ssl_local;
  
  if ((ssl->handshake == (mbedtls_ssl_handshake_params *)0x0) ||
     (ssl->conf == (mbedtls_ssl_config *)0x0)) {
    ssl_local._4_4_ = -0x7100;
  }
  else if ((pw == (uchar *)0x0) || (pw_len == 0)) {
    ssl_local._4_4_ = -0x7100;
  }
  else {
    local_2c = (mbedtls_ecjpake_role)(ssl->conf->endpoint == '\x01');
    ssl_local._4_4_ =
         mbedtls_ecjpake_setup
                   (&ssl->handshake->ecjpake_ctx,local_2c,MBEDTLS_MD_SHA256,MBEDTLS_ECP_DP_SECP256R1
                    ,pw,pw_len);
  }
  return ssl_local._4_4_;
}

Assistant:

int mbedtls_ssl_set_hs_ecjpake_password(mbedtls_ssl_context *ssl,
                                        const unsigned char *pw,
                                        size_t pw_len)
{
    mbedtls_ecjpake_role role;

    if (ssl->handshake == NULL || ssl->conf == NULL) {
        return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
    }

    /* Empty password is not valid  */
    if ((pw == NULL) || (pw_len == 0)) {
        return MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
    }

    if (ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER) {
        role = MBEDTLS_ECJPAKE_SERVER;
    } else {
        role = MBEDTLS_ECJPAKE_CLIENT;
    }

    return mbedtls_ecjpake_setup(&ssl->handshake->ecjpake_ctx,
                                 role,
                                 MBEDTLS_MD_SHA256,
                                 MBEDTLS_ECP_DP_SECP256R1,
                                 pw, pw_len);
}